

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall wasm::Output::Output(Output *this,string *filename,BinaryOption binary)

{
  pointer pcVar1;
  Output *pOVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  streambuf *psVar8;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [23];
  char *local_68;
  Output *local_60;
  string local_58;
  BinaryOption local_38;
  
  std::ofstream::ofstream(this);
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_60 = this;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + filename->_M_string_length);
  pOVar2 = local_60;
  local_38 = binary;
  iVar5 = std::__cxx11::string::compare((char *)&local_58);
  if ((iVar5 == 0) || (local_58._M_string_length == 0)) {
    psVar8 = *(streambuf **)(__gxx_personality_v0 + *(long *)(std::cout + -0x18));
  }
  else {
    bVar3 = isDebugEnabled("file");
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Opening \'",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
    }
    Path::to_path((PathString *)local_1f0,&local_58);
    std::ofstream::open((string *)pOVar2,(_Ios_Openmode)local_1f0);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
    }
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      Fatal::Fatal((Fatal *)local_1f0);
      poVar6 = (ostream *)(local_1f0 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"Failed opening output file \'",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\': ",3);
      piVar7 = __errno_location();
      local_68 = strerror(*piVar7);
      Fatal::operator<<((Fatal *)local_1f0,&local_68);
      Fatal::~Fatal((Fatal *)local_1f0);
    }
    psVar8 = (streambuf *)&pOVar2->field_0x8;
  }
  std::ostream::ostream(&this->out,psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

wasm::Output::Output(const std::string& filename, Flags::BinaryOption binary)
  : outfile(), out([this, filename, binary]() {
      // Ensure a single return at the very end, to avoid clang-tidy warnings
      // about the types of different returns here.
      std::streambuf* buffer;
      if (filename == "-" || filename.empty()) {
        buffer = std::cout.rdbuf();
      } else {
        BYN_TRACE("Opening '" << filename << "'\n");
        std::ios_base::openmode flags =
          std::ofstream::out | std::ofstream::trunc;
        if (binary == Flags::Binary) {
          flags |= std::ofstream::binary;
        }
        outfile.open(wasm::Path::to_path(filename), flags);
        if (!outfile.is_open()) {
          Fatal() << "Failed opening output file '" << filename
                  << "': " << strerror(errno);
        }
        buffer = outfile.rdbuf();
      }
      return buffer;
    }()) {}